

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LL.cpp
# Opt level: O0

void __thiscall ll_grammar::GrammarLeft::adjust_follow(GrammarLeft *this,int index)

{
  int iVar1;
  reference pvVar2;
  reference pvVar3;
  ulong uVar4;
  size_type sVar5;
  reference pvVar6;
  iterator __first;
  iterator __last;
  reference b;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_48;
  const_iterator local_40;
  const_iterator deleteIt;
  undefined1 local_30 [4];
  int i;
  vector<int,_std::allocator<int>_> tempFollow;
  int index_local;
  GrammarLeft *this_local;
  
  tempFollow.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = index;
  pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                     (&this->not_finally_char_index,(long)index);
  pvVar3 = std::
           vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ::operator[](&this->follow,(long)*pvVar2);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_30,pvVar3);
  for (deleteIt._M_current._4_4_ = 0; uVar4 = (ulong)deleteIt._M_current._4_4_,
      sVar5 = std::vector<int,_std::allocator<int>_>::size
                        ((vector<int,_std::allocator<int>_> *)local_30), uVar4 < sVar5;
      deleteIt._M_current._4_4_ = deleteIt._M_current._4_4_ + 1) {
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_30,
                        (long)deleteIt._M_current._4_4_);
    pvVar6 = std::vector<ll_grammar::ElemLeft,_std::allocator<ll_grammar::ElemLeft>_>::operator[]
                       (&this->elements,(long)*pvVar2);
    if (((pvVar6->super_Elem).is_finally & 1U) == 0) {
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                         (&this->not_finally_char_index,
                          (long)tempFollow.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage._4_4_);
      pvVar3 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[](&this->follow,(long)*pvVar2);
      __first = std::vector<int,_std::allocator<int>_>::begin(pvVar3);
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                         (&this->not_finally_char_index,
                          (long)tempFollow.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage._4_4_);
      pvVar3 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[](&this->follow,(long)*pvVar2);
      __last = std::vector<int,_std::allocator<int>_>::end(pvVar3);
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)local_30,
                          (long)deleteIt._M_current._4_4_);
      local_48 = std::
                 find<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int>
                           (__first._M_current,__last._M_current,pvVar2);
      __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
      __normal_iterator<int*>
                ((__normal_iterator<int_const*,std::vector<int,std::allocator<int>>> *)&local_40,
                 &local_48);
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                         (&this->not_finally_char_index,
                          (long)tempFollow.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage._4_4_);
      pvVar3 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[](&this->follow,(long)*pvVar2);
      std::vector<int,_std::allocator<int>_>::erase(pvVar3,local_40);
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                         (&this->not_finally_char_index,
                          (long)tempFollow.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage._4_4_);
      iVar1 = *pvVar2;
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)local_30,
                          (long)deleteIt._M_current._4_4_);
      if (iVar1 != *pvVar2) {
        pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)local_30,
                            (long)deleteIt._M_current._4_4_);
        adjust_follow(this,*pvVar2);
        pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                           (&this->not_finally_char_index,
                            (long)tempFollow.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage._4_4_);
        pvVar3 = std::
                 vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ::operator[](&this->follow,(long)*pvVar2);
        pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)local_30,
                            (long)deleteIt._M_current._4_4_);
        b = std::
            vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ::operator[](&this->follow,(long)*pvVar2);
        public_tool::connect_vector(pvVar3,b);
      }
    }
  }
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_30);
  return;
}

Assistant:

void GrammarLeft::adjust_follow(int index){
    //保存使用
    vector<int> tempFollow = follow[not_finally_char_index[index]];
    for (int i = 0; i < tempFollow.size(); i++){
        if (!elements[tempFollow[i]].is_finally){
            //在原来的Follow中将这个非终结符删除
            vector<int>::const_iterator deleteIt = find(follow[not_finally_char_index[index]].begin(), follow[not_finally_char_index[index]].end(), tempFollow[i]);
            follow[not_finally_char_index[index]].erase(deleteIt);

            //如果两个是一样的
            if (not_finally_char_index[index] != tempFollow[i]) {
                adjust_follow(tempFollow[i]);
                connect_vector(follow[not_finally_char_index[index]], follow[tempFollow[i]]);

            }




        }

    }

}